

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

double crnlib::image_utils::compute_block_ssim(uint t,uint8 *pX,uint8 *pY)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar7 = 0.0;
  uVar2 = (ulong)t;
  dVar6 = 0.0;
  dVar5 = 0.0;
  if (t != 0) {
    uVar1 = 0;
    do {
      dVar5 = dVar5 + (double)pX[uVar1];
      dVar6 = dVar6 + (double)pY[uVar1];
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  dVar5 = dVar5 / (double)uVar2;
  dVar6 = dVar6 / (double)uVar2;
  dVar3 = 0.0;
  if (t != 0) {
    uVar1 = 0;
    dVar7 = 0.0;
    do {
      dVar3 = dVar3 + ((double)pX[uVar1] - dVar5) * ((double)pX[uVar1] - dVar5);
      dVar7 = dVar7 + ((double)pY[uVar1] - dVar6) * ((double)pY[uVar1] - dVar6);
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  dVar8 = (double)(t - 1);
  dVar3 = dVar3 / dVar8;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar7 = dVar7 / dVar8;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  dVar4 = 0.0;
  if (t != 0) {
    uVar1 = 0;
    do {
      dVar4 = dVar4 + ((double)pY[uVar1] - dVar6) * ((double)pX[uVar1] - dVar5);
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  return ((dVar4 / dVar8 + dVar4 / dVar8 + 58.5225) * ((dVar5 + dVar5) * dVar6 + 6.5025)) /
         ((dVar3 * dVar3 + dVar7 * dVar7 + 58.5225) * (dVar5 * dVar5 + dVar6 * dVar6 + 6.5025));
}

Assistant:

double compute_block_ssim(uint t, const uint8* pX, const uint8* pY)
        {
            double ave_x = 0.0f;
            double ave_y = 0.0f;
            for (uint i = 0; i < t; i++)
            {
                ave_x += pX[i];
                ave_y += pY[i];
            }

            ave_x /= t;
            ave_y /= t;

            double var_x = 0.0f;
            double var_y = 0.0f;
            for (uint i = 0; i < t; i++)
            {
                var_x += math::square(pX[i] - ave_x);
                var_y += math::square(pY[i] - ave_y);
            }

            var_x = sqrt(var_x / (t - 1));
            var_y = sqrt(var_y / (t - 1));

            double covar_xy = 0.0f;
            for (uint i = 0; i < t; i++)
            {
                covar_xy += (pX[i] - ave_x) * (pY[i] - ave_y);
            }

            covar_xy /= (t - 1);

            const double c1 = 6.5025; //(255*.01)^2
            const double c2 = 58.5225; //(255*.03)^2

            double n = (2.0f * ave_x * ave_y + c1) * (2.0f * covar_xy + c2);
            double d = (ave_x * ave_x + ave_y * ave_y + c1) * (var_x * var_x + var_y * var_y + c2);

            return n / d;
        }